

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int ptls_buffer_reserve(ptls_buffer_t *buf,size_t delta)

{
  uint8_t *__src;
  ulong uVar1;
  size_t __n;
  uint8_t *__dest;
  int iVar2;
  ulong uVar3;
  ulong __size;
  
  __src = buf->base;
  iVar2 = 0x201;
  if (__src != (uint8_t *)0x0) {
    uVar1 = buf->capacity;
    __n = buf->off;
    uVar3 = delta + __n;
    if (uVar1 < uVar3) {
      __size = 0x400;
      if (0x400 < uVar1) {
        __size = uVar1;
      }
      do {
        __size = __size * 2;
      } while (__size < uVar3);
      __dest = (uint8_t *)malloc(__size);
      if (__dest == (uint8_t *)0x0) {
        return 0x201;
      }
      memcpy(__dest,__src,__n);
      ptls_buffer__release_memory(buf);
      buf->base = __dest;
      buf->capacity = __size;
      buf->is_allocated = 1;
    }
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int ptls_buffer_reserve(ptls_buffer_t *buf, size_t delta)
{
    if (buf->base == NULL)
        return PTLS_ERROR_NO_MEMORY;

    if (buf->capacity < buf->off + delta) {
        uint8_t *newp;
        size_t new_capacity = buf->capacity;
        if (new_capacity < 1024)
            new_capacity = 1024;
        do {
            new_capacity *= 2;
        } while (new_capacity < buf->off + delta);
        if ((newp = malloc(new_capacity)) == NULL)
            return PTLS_ERROR_NO_MEMORY;
        memcpy(newp, buf->base, buf->off);
        ptls_buffer__release_memory(buf);
        buf->base = newp;
        buf->capacity = new_capacity;
        buf->is_allocated = 1;
    }

    return 0;
}